

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdapi_address.cpp
# Opt level: O3

DescriptorScriptData * __thiscall
cfd::api::AddressApi::ParseOutputDescriptor
          (DescriptorScriptData *__return_storage_ptr__,AddressApi *this,string *descriptor,
          NetType net_type,string *bip32_derivation_path,
          vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_> *script_list
          ,vector<cfd::DescriptorKeyData,_std::allocator<cfd::DescriptorKeyData>_>
           *multisig_key_list,
          vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
          *prefix_list,vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *key_list)

{
  pointer pDVar1;
  pointer pDVar2;
  bool bVar3;
  pointer pDVar4;
  undefined1 auVar5 [8];
  bool bVar6;
  bool bVar7;
  uint32_t uVar8;
  AddressType AVar9;
  DescriptorScriptType DVar10;
  uint8_t auVar11 [4];
  uint32_t uVar12;
  DescriptorKeyType DVar13;
  DescriptorKeyReference *key_ref_00;
  DescriptorKeyReference *key_ref_01;
  DescriptorKeyReference *key_ref_02;
  DescriptorKeyReference *key_ref_03;
  DescriptorKeyReference *key_ref_04;
  uint32_t index;
  uint uVar14;
  pointer this_00;
  pointer this_01;
  KeyData *key;
  undefined1 __x [8];
  pointer this_02;
  vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
  script_refs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> temp_list;
  DescriptorScriptReference child;
  Descriptor desc;
  DescriptorScriptData data;
  DescriptorKeyReference key_ref;
  DescriptorNode node;
  vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
  local_1360;
  vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
  local_1348;
  pointer local_1330;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> local_1328;
  Script *local_1310;
  string *local_1308;
  string *local_1300;
  vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
  local_12f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_12d8;
  undefined1 local_12b8 [8];
  undefined1 auStack_12b0 [8];
  undefined1 local_12a8 [16];
  undefined1 local_1298 [64];
  pointer local_1258;
  TapBranch local_1240;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_11c8;
  Script local_11b0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1170 [2];
  uint8_t local_10f8 [4];
  Script local_10f0;
  DescriptorKeyType local_10b8;
  string local_10b0 [328];
  undefined1 local_f68 [32];
  undefined1 local_f48 [88];
  TapBranch local_ef0;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_e78;
  Script local_e60;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_e20 [10];
  DescriptorKeyReference *local_c18;
  DescriptorKeyReference *pDStack_c10;
  pointer local_c08 [2];
  undefined1 local_bf8 [88];
  TapBranch local_ba0;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_b28;
  Script local_b10;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_ad0 [10];
  DescriptorNode local_8c8;
  undefined1 local_760 [552];
  uint32_t local_538;
  DescriptorKeyReference local_428;
  DescriptorNode local_198;
  
  local_1328.
  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1328.
  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1328.
  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (prefix_list ==
      (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)0x0) {
    core::GetBitcoinAddressFormatList();
    local_12a8._0_8_ =
         local_1328.
         super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    auStack_12b0 = (undefined1  [8])
                   local_1328.
                   super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
    local_12b8 = (undefined1  [8])
                 local_1328.
                 super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    local_1328.
    super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_f68._16_8_;
    local_1328.
    super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)local_f68._0_8_;
    local_1328.
    super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)local_f68._8_8_;
    local_f68._0_8_ = (DescriptorKeyReference *)0x0;
    local_f68._8_8_ = (DescriptorKeyReference *)0x0;
    local_f68._16_8_ = (pointer)0x0;
    std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
    ~vector((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
            local_12b8);
    std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
    ~vector((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
            local_f68);
  }
  else {
    std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
    operator=(&local_1328,prefix_list);
  }
  if (script_list !=
      (vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_> *)0x0) {
    pDVar1 = (script_list->
             super__Vector_base<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pDVar2 = (script_list->
             super__Vector_base<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    this_01 = pDVar1;
    if (pDVar2 != pDVar1) {
      do {
        DescriptorScriptData::~DescriptorScriptData(this_01);
        this_01 = this_01 + 1;
      } while (this_01 != pDVar2);
      (script_list->
      super__Vector_base<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_>).
      _M_impl.super__Vector_impl_data._M_finish = pDVar1;
    }
  }
  if (multisig_key_list !=
      (vector<cfd::DescriptorKeyData,_std::allocator<cfd::DescriptorKeyData>_> *)0x0) {
    std::vector<cfd::DescriptorKeyData,_std::allocator<cfd::DescriptorKeyData>_>::clear
              (multisig_key_list);
  }
  DescriptorScriptData::DescriptorScriptData(__return_storage_ptr__);
  __return_storage_ptr__->key_type = kDescriptorKeyNull;
  __return_storage_ptr__->address_type = kP2shAddress;
  __return_storage_ptr__->multisig_req_sig_num = 0;
  core::Descriptor::Parse((Descriptor *)&local_8c8,descriptor,&local_1328);
  local_12d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_12d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_12d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (uVar14 = 0; uVar8 = core::Descriptor::GetNeedArgumentNum((Descriptor *)&local_8c8),
      uVar14 < uVar8; uVar14 = uVar14 + 1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&local_12d8,bip32_derivation_path);
  }
  if (key_list != (vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)0x0) {
    core::Descriptor::GetKeyDataAll
              ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)local_12b8,
               (Descriptor *)&local_8c8,&local_12d8);
    auVar5 = auStack_12b0;
    for (__x = local_12b8; __x != auVar5;
        __x = (undefined1  [8])&(((DescriptorKeyReference *)__x)->key_data_).privkey_.is_compressed_
        ) {
      std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::push_back
                (key_list,(value_type *)__x);
    }
    std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::~vector
              ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)local_12b8);
  }
  core::Descriptor::GetReferenceAll(&local_1360,(Descriptor *)&local_8c8,&local_12d8);
  core::Descriptor::GetNode(&local_198,(Descriptor *)&local_8c8);
  __return_storage_ptr__->type = local_198.script_type_;
  __return_storage_ptr__->key_type = kDescriptorKeyNull;
  __return_storage_ptr__->depth = 0;
  core::DescriptorScriptReference::GetLockingScript
            ((Script *)local_12b8,
             local_1360.
             super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
             ._M_impl.super__Vector_impl_data._M_start);
  core::Script::operator=(&__return_storage_ptr__->locking_script,(Script *)local_12b8);
  core::Script::~Script((Script *)local_12b8);
  bVar6 = core::DescriptorScriptReference::HasAddress
                    (local_1360.
                     super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                     ._M_impl.super__Vector_impl_data._M_start);
  if (bVar6) {
    core::DescriptorScriptReference::GenerateAddress
              ((Address *)local_12b8,
               local_1360.
               super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
               ._M_impl.super__Vector_impl_data._M_start,net_type);
    core::Address::operator=(&__return_storage_ptr__->address,(Address *)local_12b8);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(local_1170);
    core::Script::~Script(&local_11b0);
    local_1240._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_0072eb30;
    std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
              (&local_11c8);
    core::TapBranch::~TapBranch(&local_1240);
    if (local_1258 != (pointer)0x0) {
      operator_delete(local_1258);
    }
    if ((_func_int **)local_1298._40_8_ != (_func_int **)0x0) {
      operator_delete((void *)local_1298._40_8_);
    }
    if ((pointer)local_1298._16_8_ != (pointer)0x0) {
      operator_delete((void *)local_1298._16_8_);
    }
    if ((pointer)local_12a8._0_8_ != (pointer)local_1298) {
      operator_delete((void *)local_12a8._0_8_);
    }
    AVar9 = core::DescriptorScriptReference::GetAddressType
                      (local_1360.
                       super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                       ._M_impl.super__Vector_impl_data._M_start);
    __return_storage_ptr__->address_type = AVar9;
  }
  bVar6 = core::DescriptorScriptReference::HasRedeemScript
                    (local_1360.
                     super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                     ._M_impl.super__Vector_impl_data._M_start);
  if (bVar6) {
    core::DescriptorScriptReference::GetRedeemScript
              ((Script *)local_12b8,
               local_1360.
               super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
               ._M_impl.super__Vector_impl_data._M_start);
    core::Script::operator=(&__return_storage_ptr__->redeem_script,(Script *)local_12b8);
    core::Script::~Script((Script *)local_12b8);
  }
  local_1348.
  super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
  ._M_impl.super__Vector_impl_data._M_start = (DescriptorKeyReference *)0x0;
  local_1348.
  super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
  ._M_impl.super__Vector_impl_data._M_finish = (DescriptorKeyReference *)0x0;
  local_1348.
  super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  core::DescriptorKeyReference::DescriptorKeyReference(&local_428);
  switch(__return_storage_ptr__->type) {
  case kDescriptorScriptSh:
  case kDescriptorScriptWsh:
    core::DescriptorScriptReference::DescriptorScriptReference
              ((DescriptorScriptReference *)local_12b8,
               local_1360.
               super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
               ._M_impl.super__Vector_impl_data._M_start);
    bVar6 = core::DescriptorScriptReference::HasChild((DescriptorScriptReference *)local_12b8);
    if (bVar6) {
      core::Script::Script((Script *)local_f68);
    }
    else {
      core::DescriptorScriptReference::GetRedeemScript
                ((Script *)local_f68,(DescriptorScriptReference *)local_12b8);
    }
    local_1310 = &__return_storage_ptr__->redeem_script;
    core::Script::operator=(local_1310,(Script *)local_f68);
    core::Script::~Script((Script *)local_f68);
    if (bVar6) {
      local_1300 = (string *)(local_760 + 0x208);
      local_1308 = (string *)&__return_storage_ptr__->key;
      bVar3 = true;
      bVar6 = true;
      local_1330 = (pointer)&PTR__TaprootScriptTree_0072eb30;
      uVar8 = 0;
      uVar12 = 0;
      do {
        core::DescriptorScriptReference::DescriptorScriptReference
                  ((DescriptorScriptReference *)local_f68);
        DescriptorScriptData::DescriptorScriptData((DescriptorScriptData *)local_760);
        DVar10 = core::DescriptorScriptReference::GetScriptType
                           ((DescriptorScriptReference *)local_12b8);
        if (DVar10 - kDescriptorScriptSh < 2) {
          bVar7 = core::DescriptorScriptReference::HasChild((DescriptorScriptReference *)local_12b8)
          ;
          if (bVar7) {
            core::DescriptorScriptReference::GetChild
                      ((DescriptorScriptReference *)&local_c18,
                       (DescriptorScriptReference *)local_12b8);
            core::DescriptorScriptReference::operator=
                      ((DescriptorScriptReference *)local_f68,
                       (DescriptorScriptReference *)&local_c18);
            core::DescriptorScriptReference::~DescriptorScriptReference
                      ((DescriptorScriptReference *)&local_c18);
            DVar10 = core::DescriptorScriptReference::GetScriptType
                               ((DescriptorScriptReference *)local_f68);
            if ((DVar10 == kDescriptorScriptMulti) ||
               (DVar10 = core::DescriptorScriptReference::GetScriptType
                                   ((DescriptorScriptReference *)local_f68),
               DVar10 == kDescriptorScriptSortedMulti)) {
              core::DescriptorScriptReference::GetKeyList
                        (&local_12f8,(DescriptorScriptReference *)local_f68);
              local_c08[0] = local_1348.
                             super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage;
              pDStack_c10 = local_1348.
                            super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
              local_c18 = local_1348.
                          super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                          ._M_impl.super__Vector_impl_data._M_start;
              local_1348.
              super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage =
                   local_12f8.
                   super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
              local_1348.
              super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   local_12f8.
                   super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              local_1348.
              super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   local_12f8.
                   super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              local_12f8.
              super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
              ._M_impl.super__Vector_impl_data._M_start = (DescriptorKeyReference *)0x0;
              local_12f8.
              super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
              ._M_impl.super__Vector_impl_data._M_finish = (DescriptorKeyReference *)0x0;
              local_12f8.
              super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              std::
              vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
              ::~vector((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                         *)&local_c18);
              std::
              vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
              ::~vector(&local_12f8);
              uVar12 = core::DescriptorScriptReference::GetReqNum
                                 ((DescriptorScriptReference *)local_f68);
              __return_storage_ptr__->multisig_req_sig_num = uVar12;
              bVar6 = false;
            }
            else {
              DVar10 = core::DescriptorScriptReference::GetScriptType
                                 ((DescriptorScriptReference *)local_f68);
              bVar6 = bVar3;
              if (DVar10 == kDescriptorScriptMiniscript) {
                bVar6 = false;
              }
            }
            DVar10 = core::DescriptorScriptReference::GetScriptType
                               ((DescriptorScriptReference *)local_f68);
            bVar3 = bVar6;
            if (DVar10 == kDescriptorScriptWpkh) goto LAB_003b8bdc;
            core::DescriptorScriptReference::GetRedeemScript
                      ((Script *)&local_c18,(DescriptorScriptReference *)local_12b8);
            core::Script::operator=(local_1310,(Script *)&local_c18);
          }
          else {
            core::DescriptorScriptReference::GetRedeemScript
                      ((Script *)&local_c18,(DescriptorScriptReference *)local_12b8);
            core::Script::operator=(local_1310,(Script *)&local_c18);
          }
          core::Script::~Script((Script *)&local_c18);
        }
        else {
          bVar3 = false;
          bVar6 = false;
        }
LAB_003b8bdc:
        local_760._0_4_ =
             core::DescriptorScriptReference::GetScriptType((DescriptorScriptReference *)local_12b8)
        ;
        local_760._64_4_ = uVar8;
        core::DescriptorScriptReference::GetLockingScript
                  ((Script *)&local_c18,(DescriptorScriptReference *)local_12b8);
        core::Script::operator=((Script *)(local_760 + 8),(Script *)&local_c18);
        core::Script::~Script((Script *)&local_c18);
        core::DescriptorScriptReference::GenerateAddress
                  ((Address *)&local_c18,(DescriptorScriptReference *)local_12b8,net_type);
        core::Address::operator=((Address *)(local_760 + 0x48),(Address *)&local_c18);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree(local_ad0);
        core::Script::~Script(&local_b10);
        local_ba0._vptr_TapBranch = (_func_int **)local_1330;
        std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                  (&local_b28);
        core::TapBranch::~TapBranch(&local_ba0);
        if ((pointer)local_bf8._64_8_ != (pointer)0x0) {
          operator_delete((void *)local_bf8._64_8_);
        }
        if ((_func_int **)local_bf8._40_8_ != (_func_int **)0x0) {
          operator_delete((void *)local_bf8._40_8_);
        }
        if ((pointer)local_bf8._16_8_ != (pointer)0x0) {
          operator_delete((void *)local_bf8._16_8_);
        }
        if (local_c08[0] != (pointer)local_bf8) {
          operator_delete(local_c08[0]);
        }
        local_760._448_4_ =
             core::DescriptorScriptReference::GetAddressType
                       ((DescriptorScriptReference *)local_12b8);
        bVar7 = core::DescriptorScriptReference::HasRedeemScript
                          ((DescriptorScriptReference *)local_12b8);
        if (bVar7) {
          core::DescriptorScriptReference::GetRedeemScript
                    ((Script *)&local_c18,(DescriptorScriptReference *)local_12b8);
          core::Script::operator=((Script *)(local_760 + 0x1c8),(Script *)&local_c18);
          core::Script::~Script((Script *)&local_c18);
        }
        bVar7 = core::DescriptorScriptReference::HasKey((DescriptorScriptReference *)local_12b8);
        if (bVar7) {
          core::DescriptorScriptReference::GetKeyList
                    ((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                      *)&local_c18,(DescriptorScriptReference *)local_12b8);
          core::DescriptorKeyReference::operator=(&local_428,local_c18);
          std::
          vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
          ::~vector((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                     *)&local_c18);
          local_760._512_4_ = core::DescriptorKeyReference::GetKeyType(&local_428);
          const::$_0::operator()::DescriptorKeyReference_const___const
                    ((string *)&local_c18,&local_428,key_ref_02);
          std::__cxx11::string::operator=(local_1300,(string *)&local_c18);
          if (local_c18 != (DescriptorKeyReference *)local_c08) {
            operator_delete(local_c18);
          }
          DVar13 = core::DescriptorKeyReference::GetKeyType(&local_428);
          __return_storage_ptr__->key_type = DVar13;
          const::$_0::operator()::DescriptorKeyReference_const___const
                    ((string *)&local_c18,&local_428,key_ref_03);
          std::__cxx11::string::operator=(local_1308,(string *)&local_c18);
          if (local_c18 != (DescriptorKeyReference *)local_c08) {
            operator_delete(local_c18);
          }
        }
        else {
          local_760._512_4_ = kDescriptorKeyNull;
        }
        local_538 = uVar12;
        if (script_list !=
            (vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_> *)0x0) {
          std::vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_>::
          push_back(script_list,(value_type *)local_760);
        }
        if ((bVar6) &&
           (bVar7 = core::DescriptorScriptReference::HasChild
                              ((DescriptorScriptReference *)local_12b8), bVar7)) {
          core::DescriptorScriptReference::GetChild
                    ((DescriptorScriptReference *)&local_c18,(DescriptorScriptReference *)local_12b8
                    );
          core::DescriptorScriptReference::operator=
                    ((DescriptorScriptReference *)local_f68,(DescriptorScriptReference *)&local_c18)
          ;
          core::DescriptorScriptReference::~DescriptorScriptReference
                    ((DescriptorScriptReference *)&local_c18);
          core::DescriptorScriptReference::operator=
                    ((DescriptorScriptReference *)local_12b8,(DescriptorScriptReference *)local_f68)
          ;
          uVar8 = uVar8 + 1;
        }
        else {
          bVar3 = false;
          bVar6 = false;
        }
        DescriptorScriptData::~DescriptorScriptData((DescriptorScriptData *)local_760);
        core::DescriptorScriptReference::~DescriptorScriptReference
                  ((DescriptorScriptReference *)local_f68);
      } while (bVar6);
    }
    core::DescriptorScriptReference::~DescriptorScriptReference
              ((DescriptorScriptReference *)local_12b8);
    break;
  case kDescriptorScriptPk:
  case kDescriptorScriptPkh:
  case kDescriptorScriptWpkh:
    core::DescriptorScriptReference::GetKeyList
              ((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                *)local_12b8,
               local_1360.
               super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
               ._M_impl.super__Vector_impl_data._M_start);
    core::DescriptorKeyReference::operator=(&local_428,(DescriptorKeyReference *)local_12b8);
    std::
    vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>::
    ~vector((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
             *)local_12b8);
    DVar13 = core::DescriptorKeyReference::GetKeyType(&local_428);
    __return_storage_ptr__->key_type = DVar13;
    const::$_0::operator()::DescriptorKeyReference_const___const
              ((string *)local_12b8,&local_428,key_ref_00);
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->key,(string *)local_12b8);
    if (local_12b8 != (undefined1  [8])local_12a8) {
      operator_delete((void *)local_12b8);
    }
    break;
  case kDescriptorScriptCombo:
    if (local_1360.
        super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_1360.
        super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      local_1330 = (pointer)&__return_storage_ptr__->key;
      this_00 = local_1360.
                super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        DescriptorScriptData::DescriptorScriptData((DescriptorScriptData *)local_12b8);
        DVar10 = core::DescriptorScriptReference::GetScriptType(this_00);
        local_12b8._0_4_ = DVar10;
        local_1298._32_4_ = 0;
        core::DescriptorScriptReference::GetLockingScript((Script *)local_f68,this_00);
        core::Script::operator=((Script *)auStack_12b0,(Script *)local_f68);
        core::Script::~Script((Script *)local_f68);
        bVar6 = core::DescriptorScriptReference::HasAddress(this_00);
        auVar11[0] = '\x01';
        auVar11[1] = '\0';
        auVar11[2] = '\0';
        auVar11[3] = '\0';
        if (bVar6) {
          core::DescriptorScriptReference::GenerateAddress((Address *)local_f68,this_00,net_type);
          core::Address::operator=((Address *)(local_1298 + 0x28),(Address *)local_f68);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~_Rb_tree(local_e20);
          core::Script::~Script(&local_e60);
          local_ef0._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_0072eb30;
          std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                    (&local_e78);
          core::TapBranch::~TapBranch(&local_ef0);
          if ((pointer)local_f48._64_8_ != (pointer)0x0) {
            operator_delete((void *)local_f48._64_8_);
          }
          if ((_func_int **)local_f48._40_8_ != (_func_int **)0x0) {
            operator_delete((void *)local_f48._40_8_);
          }
          if ((pointer)local_f48._16_8_ != (pointer)0x0) {
            operator_delete((void *)local_f48._16_8_);
          }
          if ((pointer)local_f68._16_8_ != (pointer)local_f48) {
            operator_delete((void *)local_f68._16_8_);
          }
          auVar11 = (uint8_t  [4])core::DescriptorScriptReference::GetAddressType(this_00);
        }
        local_10f8 = auVar11;
        bVar6 = core::DescriptorScriptReference::HasRedeemScript(this_00);
        if (bVar6) {
          core::DescriptorScriptReference::GetRedeemScript((Script *)local_f68,this_00);
          core::Script::operator=(&local_10f0,(Script *)local_f68);
          core::Script::~Script((Script *)local_f68);
          local_10b8 = kDescriptorKeyNull;
        }
        else {
          core::DescriptorScriptReference::GetKeyList
                    ((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                      *)local_f68,this_00);
          core::DescriptorKeyReference::operator=
                    (&local_428,(DescriptorKeyReference *)local_f68._0_8_);
          std::
          vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
          ::~vector((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                     *)local_f68);
          local_10b8 = core::DescriptorKeyReference::GetKeyType(&local_428);
          const::$_0::operator()::DescriptorKeyReference_const___const
                    ((string *)local_f68,&local_428,key_ref_01);
          std::__cxx11::string::operator=(local_10b0,(string *)local_f68);
          if ((DescriptorKeyReference *)local_f68._0_8_ !=
              (DescriptorKeyReference *)(local_f68 + 0x10)) {
            operator_delete((void *)local_f68._0_8_);
          }
          if (__return_storage_ptr__->key_type == kDescriptorKeyNull) {
            __return_storage_ptr__->key_type = local_10b8;
            std::__cxx11::string::_M_assign((string *)local_1330);
          }
        }
        if (script_list !=
            (vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_> *)0x0) {
          std::vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_>::
          push_back(script_list,(DescriptorScriptData *)local_12b8);
        }
        DescriptorScriptData::~DescriptorScriptData((DescriptorScriptData *)local_12b8);
        this_00 = this_00 + 1;
      } while (this_00 !=
               local_1360.
               super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    break;
  case kDescriptorScriptMulti:
  case kDescriptorScriptSortedMulti:
    core::DescriptorScriptReference::GetKeyList
              ((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                *)local_f68,
               local_1360.
               super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
               ._M_impl.super__Vector_impl_data._M_start);
    local_12a8._0_8_ =
         local_1348.
         super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    auStack_12b0 = (undefined1  [8])
                   local_1348.
                   super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
    local_12b8 = (undefined1  [8])
                 local_1348.
                 super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    local_1348.
    super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_f68._16_8_;
    local_1348.
    super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_f68._0_8_;
    local_1348.
    super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_f68._8_8_;
    local_f68._0_8_ = (DescriptorKeyReference *)0x0;
    local_f68._8_8_ = (DescriptorKeyReference *)0x0;
    local_f68._16_8_ = (pointer)0x0;
    std::
    vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>::
    ~vector((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
             *)local_12b8);
    std::
    vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>::
    ~vector((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
             *)local_f68);
    uVar8 = core::DescriptorScriptReference::GetReqNum
                      (local_1360.
                       super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                       ._M_impl.super__Vector_impl_data._M_start);
    __return_storage_ptr__->multisig_req_sig_num = uVar8;
  }
  pDVar4 = local_1348.
           super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (local_1348.
      super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_1348.
      super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
      ._M_impl.super__Vector_impl_data._M_finish &&
      multisig_key_list !=
      (vector<cfd::DescriptorKeyData,_std::allocator<cfd::DescriptorKeyData>_> *)0x0) {
    this_02 = local_1348.
              super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      DVar13 = core::DescriptorKeyReference::GetKeyType(this_02);
      local_12b8._0_4_ = DVar13;
      const::$_0::operator()::DescriptorKeyReference_const___const
                ((string *)auStack_12b0,this_02,key_ref_04);
      std::vector<cfd::DescriptorKeyData,_std::allocator<cfd::DescriptorKeyData>_>::push_back
                (multisig_key_list,(value_type *)local_12b8);
      if (auStack_12b0 != (undefined1  [8])(local_12a8 + 8)) {
        operator_delete((void *)auStack_12b0);
      }
      this_02 = this_02 + 1;
    } while (this_02 != pDVar4);
  }
  core::DescriptorKeyReference::~DescriptorKeyReference(&local_428);
  std::vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
  ::~vector(&local_1348);
  core::DescriptorNode::~DescriptorNode(&local_198);
  std::
  vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
  ::~vector(&local_1360);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_12d8);
  core::DescriptorNode::~DescriptorNode(&local_8c8);
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            (&local_1328);
  return __return_storage_ptr__;
}

Assistant:

DescriptorScriptData AddressApi::ParseOutputDescriptor(
    const std::string& descriptor, NetType net_type,
    const std::string& bip32_derivation_path,
    std::vector<DescriptorScriptData>* script_list,
    std::vector<DescriptorKeyData>* multisig_key_list,
    const std::vector<AddressFormatData>* prefix_list,
    std::vector<KeyData>* key_list) const {
  std::vector<AddressFormatData> addr_prefixes;
  if (prefix_list == nullptr) {
    addr_prefixes = cfd::core::GetBitcoinAddressFormatList();
  } else {
    addr_prefixes = *prefix_list;
  }
  if (script_list != nullptr) script_list->clear();
  if (multisig_key_list != nullptr) multisig_key_list->clear();

  static auto get_keystr_function =
      [](const DescriptorKeyReference& key_ref) -> std::string {
    if (key_ref.HasExtPrivkey()) {
      return key_ref.GetExtPrivkey().ToString();
    } else if (key_ref.HasExtPubkey()) {
      return key_ref.GetExtPubkey().ToString();
    } else {
      return key_ref.GetPubkey().GetHex();
    }
  };

  DescriptorScriptData result;
  result.key_type = DescriptorKeyType::kDescriptorKeyNull;  // dummy init
  result.address_type = AddressType::kP2shAddress;          // dummy init
  result.multisig_req_sig_num = 0;
  Descriptor desc = Descriptor::Parse(descriptor, &addr_prefixes);
  std::vector<std::string> args;
  for (uint32_t index = 0; index < desc.GetNeedArgumentNum(); ++index) {
    args.push_back(bip32_derivation_path);
  }
  if (key_list != nullptr) {
    auto temp_list = desc.GetKeyDataAll(&args);
    for (const auto& key : temp_list) {
      key_list->push_back(key);
    }
  }
  std::vector<DescriptorScriptReference> script_refs =
      desc.GetReferenceAll(&args);
  DescriptorNode node = desc.GetNode();

  result.type = node.GetScriptType();
  result.key_type = DescriptorKeyType::kDescriptorKeyNull;
  result.depth = 0;
  result.locking_script = script_refs[0].GetLockingScript();
  if (script_refs[0].HasAddress()) {
    result.address = script_refs[0].GenerateAddress(net_type);
    result.address_type = script_refs[0].GetAddressType();
  }
  if (script_refs[0].HasRedeemScript()) {
    result.redeem_script = script_refs[0].GetRedeemScript();
  }

  std::vector<DescriptorKeyReference> multisig_keys;
  uint32_t multisig_req_num = 0;
  bool use_script_list = false;
  DescriptorKeyReference key_ref;
  switch (result.type) {
    case DescriptorScriptType::kDescriptorScriptCombo:
      for (const auto& ref : script_refs) {
        DescriptorScriptData ref_data;
        ref_data.type = ref.GetScriptType();
        ref_data.depth = 0;
        ref_data.locking_script = ref.GetLockingScript();
        if (ref.HasAddress()) {
          ref_data.address = ref.GenerateAddress(net_type);
          ref_data.address_type = ref.GetAddressType();
        } else {
          ref_data.address_type = AddressType::kP2shAddress;  // dummy init
        }
        if (ref.HasRedeemScript()) {
          ref_data.redeem_script = ref.GetRedeemScript();
          ref_data.key_type = DescriptorKeyType::kDescriptorKeyNull;
        } else {
          key_ref = ref.GetKeyList()[0];
          ref_data.key_type = key_ref.GetKeyType();
          ref_data.key = get_keystr_function(key_ref);
          if (result.key_type == DescriptorKeyType::kDescriptorKeyNull) {
            result.key_type = ref_data.key_type;
            result.key = ref_data.key;
          }
        }
        if (script_list != nullptr) script_list->push_back(ref_data);
      }
      break;
    case DescriptorScriptType::kDescriptorScriptSh:
    case DescriptorScriptType::kDescriptorScriptWsh:
      use_script_list = true;
      break;
    case DescriptorScriptType::kDescriptorScriptPk:
    case DescriptorScriptType::kDescriptorScriptPkh:
    case DescriptorScriptType::kDescriptorScriptWpkh:
      key_ref = script_refs[0].GetKeyList()[0];
      result.key_type = key_ref.GetKeyType();
      result.key = get_keystr_function(key_ref);
      break;
    case DescriptorScriptType::kDescriptorScriptMulti:
    case DescriptorScriptType::kDescriptorScriptSortedMulti:
      multisig_keys = script_refs[0].GetKeyList();
      result.multisig_req_sig_num = script_refs[0].GetReqNum();
      break;
    case DescriptorScriptType::kDescriptorScriptRaw:
    case DescriptorScriptType::kDescriptorScriptAddr:
    default:
      break;
  }

  if (use_script_list) {
    DescriptorScriptReference script_ref = script_refs[0];
    bool is_loop = script_ref.HasChild();
    uint32_t depth = 0;
    result.redeem_script = (is_loop) ? Script() : script_ref.GetRedeemScript();
    while (is_loop) {
      DescriptorScriptReference child;
      DescriptorScriptData data;
      switch (script_ref.GetScriptType()) {
        case DescriptorScriptType::kDescriptorScriptSh:
        case DescriptorScriptType::kDescriptorScriptWsh:
          if (!script_ref.HasChild()) {
            result.redeem_script = script_ref.GetRedeemScript();
          } else {
            child = script_ref.GetChild();
            if ((child.GetScriptType() ==
                 DescriptorScriptType::kDescriptorScriptMulti) ||
                (child.GetScriptType() ==
                 DescriptorScriptType::kDescriptorScriptSortedMulti)) {
              multisig_keys = child.GetKeyList();
              multisig_req_num = child.GetReqNum();
              result.multisig_req_sig_num = multisig_req_num;
              is_loop = false;
            } else if (
                child.GetScriptType() ==
                DescriptorScriptType::kDescriptorScriptMiniscript) {
              is_loop = false;
            }
            if (child.GetScriptType() !=
                DescriptorScriptType::kDescriptorScriptWpkh) {
              result.redeem_script = script_ref.GetRedeemScript();
            }
          }
          break;
        // case DescriptorScriptType::kDescriptorScriptPk:
        // case DescriptorScriptType::kDescriptorScriptPkh:
        // case DescriptorScriptType::kDescriptorScriptWpkh:
        default:
          is_loop = false;
          break;
      }
      data.type = script_ref.GetScriptType();
      data.depth = depth;
      data.locking_script = script_ref.GetLockingScript();
      data.address = script_ref.GenerateAddress(net_type);
      data.address_type = script_ref.GetAddressType();
      if (script_ref.HasRedeemScript()) {
        data.redeem_script = script_ref.GetRedeemScript();
      }
      if (script_ref.HasKey()) {
        key_ref = script_ref.GetKeyList()[0];
        data.key_type = key_ref.GetKeyType();
        data.key = get_keystr_function(key_ref);
        result.key_type = key_ref.GetKeyType();
        result.key = get_keystr_function(key_ref);
      } else {
        data.key_type = DescriptorKeyType::kDescriptorKeyNull;
      }
      data.multisig_req_sig_num = multisig_req_num;

      if (script_list != nullptr) script_list->push_back(data);
      if (is_loop && script_ref.HasChild()) {
        child = script_ref.GetChild();
        script_ref = child;
        ++depth;
      } else {
        is_loop = false;
      }
    }
  }

  if ((!multisig_keys.empty()) && multisig_key_list) {
    for (const auto& ref : multisig_keys) {
      DescriptorKeyData key_data{ref.GetKeyType(), get_keystr_function(ref)};
      multisig_key_list->push_back(key_data);
    }
  }
  return result;
}